

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O0

intmax_t __thiscall pstack::Dwarf::DWARFReader::getint(DWARFReader *this,size_t len)

{
  int iVar1;
  Exception *this_00;
  Exception *pEVar2;
  element_type *this_01;
  ulong local_1f8;
  size_t i;
  uint8_t *p;
  Exception local_1d8;
  byte local_38 [8];
  uint8_t bytes [16];
  ulong local_20;
  intmax_t rc;
  size_t len_local;
  DWARFReader *this_local;
  
  rc = len;
  len_local = (size_t)this;
  if ((len < 0x11) && (len != 0)) {
    this_01 = std::
              __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->io);
    Reader::readObj<unsigned_char>(this_01,this->off,local_38,rc);
    this->off = rc + this->off;
    iVar1 = 0;
    if ((local_38[rc + -1] & 0x80) != 0) {
      iVar1 = -1;
    }
    local_20 = (ulong)iVar1;
    for (local_1f8 = 1; local_1f8 <= (ulong)rc; local_1f8 = local_1f8 + 1) {
      local_20 = local_20 << 8 | (ulong)local_38[rc - local_1f8];
    }
    return local_20;
  }
  this_00 = (Exception *)__cxa_allocate_exception();
  memset(&local_1d8,0,0x1a0);
  Exception::Exception(&local_1d8);
  pEVar2 = Exception::operator<<(&local_1d8,(char (*) [30])"can\'t deal with ints of size ");
  pEVar2 = Exception::operator<<(pEVar2,(unsigned_long *)&rc);
  Exception::Exception(this_00,pEVar2);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

intmax_t getint(size_t len) {
        intmax_t rc;
        uint8_t bytes[16];
        if (len > 16 || len < 1)
            throw Exception() << "can't deal with ints of size " << len;
        io->readObj(off, bytes, len);
        off += len;
        uint8_t *p = bytes + len;
        rc = (p[-1] & 0x80) ? -1 : 0;
        for (size_t i = 1; i <= len; i++)
            rc = rc << 8 | p[-i];
        return rc;
    }